

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O3

optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0> __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(dwarf_resolver *this,die_object *cu_die)

{
  pointer plVar1;
  pointer plVar2;
  int iVar3;
  cache_mode cVar4;
  iterator iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  die_object *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long lVar9;
  undefined8 extraout_RDX_01;
  undefined8 uVar10;
  long lVar11;
  __hashtable *__h;
  _Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>,std::allocator<std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false,_false>,_bool>
  pVar12;
  optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0> oVar13;
  source_location location;
  Dwarf_Small table_count;
  Dwarf_Signed line_count;
  vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
  line_entries;
  Dwarf_Addr low_addr;
  Dwarf_Addr addr;
  Dwarf_Line_Context line_context;
  Dwarf_Unsigned version;
  Dwarf_Off off;
  Dwarf_Line *line_buffer;
  Dwarf_Signed linecount_actuals;
  Dwarf_Line *linebuf_actuals;
  undefined7 in_stack_fffffffffffffee8;
  byte in_stack_fffffffffffffeef;
  size_type local_110;
  vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
  local_108;
  Dwarf_Error local_f0;
  die_object *local_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [16];
  bool local_b0;
  bool local_a4;
  bool local_9c;
  Dwarf_Error local_98;
  _Alloc_hider local_90;
  _Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>,std::allocator<std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_88;
  anon_union_8_2_d41c7fdf_for_optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>_2
  local_80;
  Dwarf_Line local_78;
  Dwarf_Error local_70;
  Dwarf_Line local_68;
  Dwarf_Line_Context local_60;
  vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
  local_58;
  Dwarf_Signed local_40;
  Dwarf_Line *local_38;
  
  local_70 = (Dwarf_Error)die_object::get_global_offset(in_RDX);
  this_00 = (_Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>,std::allocator<std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             *)&cu_die[4].die;
  iVar5 = std::
          _Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_std::allocator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_std::allocator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this_00,(key_type *)&local_70);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_e0._0_8_ = (Dwarf_Error)0x0;
    iVar3 = dwarf_srclines_b(in_RDX->die,(Dwarf_Unsigned *)&local_78,&stack0xfffffffffffffeef,
                             (Dwarf_Line_Context *)&local_90,(Dwarf_Error *)local_e0);
    if (iVar3 == 1) {
      handle_dwarf_error((Dwarf_Debug)cu_die[2].die,(Dwarf_Error)local_e0._0_8_);
    }
    if (2 < in_stack_fffffffffffffeef) {
      location._8_8_ = "Unknown dwarf line table count";
      location.file = (char *)0x27e;
      assert_fail((detail *)0x1,0x1d2ba5,
                  "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                  ,location,(char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    }
    if (iVar3 == 0) {
      local_108.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cVar4 = get_cache_mode();
      if (cVar4 == prioritize_speed) {
        local_68 = (Dwarf_Line)0x0;
        local_110 = 0;
        local_38 = (Dwarf_Line *)0x0;
        local_40 = 0;
        local_e0._0_8_ = (Dwarf_Error)0x0;
        iVar3 = dwarf_srclines_two_level_from_linecontext
                          ((Dwarf_Line_Context)local_90._M_p,(Dwarf_Line **)&local_68,
                           (Dwarf_Signed *)&local_110,&local_38,&local_40,(Dwarf_Error *)local_e0);
        if (iVar3 == 1) {
          handle_dwarf_error((Dwarf_Debug)cu_die[2].die,(Dwarf_Error)local_e0._0_8_);
        }
        if (iVar3 != 0) {
          assert_fail((detail *)0x1,0x1d2a16,
                      "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                      ,(source_location)ZEXT816(0x296),
                      (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
        }
        local_e8 = cu_die;
        local_88 = this_00;
        local_80 = (anon_union_8_2_d41c7fdf_for_optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>_2
                    )this;
        std::
        vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
        ::reserve(&local_108,local_110);
        if (0 < (long)local_110) {
          lVar11 = 0;
          lVar6 = 0;
          do {
            local_f0 = (Dwarf_Error)0x0;
            local_e0._0_8_ = (Dwarf_Error)0x0;
            iVar3 = dwarf_lineaddr((Dwarf_Line)(&local_68->li_address)[lVar11],
                                   (Dwarf_Addr *)&local_f0,(Dwarf_Error *)local_e0);
            if (iVar3 == 1) {
              handle_dwarf_error((Dwarf_Debug)local_e8[2].die,(Dwarf_Error)local_e0._0_8_);
            }
            if (iVar3 != 0) {
              assert_fail((detail *)0x1,0x1d2c6a,
                          "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                          ,(source_location)ZEXT816(0x29d),
                          (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
            }
            lVar11 = lVar6 << 0x20;
            lVar7 = (long)(int)lVar6;
            do {
              lVar9 = lVar11;
              lVar6 = lVar7 + 1;
              if ((long)local_110 <= lVar6) break;
              local_98 = (Dwarf_Error)0x0;
              local_e0._0_8_ = (Dwarf_Error)0x0;
              iVar3 = dwarf_lineaddr((Dwarf_Line)(&(local_68->li_l_data).li_discriminator)[lVar7],
                                     (Dwarf_Addr *)&local_98,(Dwarf_Error *)local_e0);
              if (iVar3 == 1) {
                handle_dwarf_error((Dwarf_Debug)local_e8[2].die,(Dwarf_Error)local_e0._0_8_);
              }
              if (iVar3 != 0) {
                assert_fail((detail *)0x1,0x1d2c9d,
                            "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                            ,(source_location)ZEXT816(0x2a2),
                            (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
              }
              lVar11 = lVar9 + 0x100000000;
              lVar7 = lVar6;
            } while (local_98 == local_f0);
            local_e0._8_8_ = *(undefined8 *)((long)&local_68->li_address + (lVar9 >> 0x1d));
            local_e0._0_8_ = local_f0;
            local_b0 = false;
            local_a4 = false;
            local_9c = false;
            std::
            vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
            ::emplace_back<cpptrace::detail::libdwarf::line_entry>
                      (&local_108,(line_entry *)local_e0);
            local_9c = false;
            local_a4 = false;
            if ((local_b0 == true) && ((undefined1 *)local_e0._16_8_ != local_c0)) {
              operator_delete((void *)local_e0._16_8_,local_c0._0_8_ + 1);
            }
            lVar11 = lVar9 + 0x100000000 >> 0x20;
          } while (lVar11 < (long)local_110);
        }
        plVar2 = local_108.
                 super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        plVar1 = local_108.
                 super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this = (dwarf_resolver *)local_80;
        this_00 = local_88;
        if (local_108.
            super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_108.
            super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          uVar8 = ((long)local_108.
                         super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_108.
                         super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
          lVar6 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar6 == 0; lVar6 = lVar6 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<cpptrace::detail::libdwarf::line_entry*,std::vector<cpptrace::detail::libdwarf::line_entry,std::allocator<cpptrace::detail::libdwarf::line_entry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(cpptrace::detail::libdwarf::die_object_const&)::_lambda(cpptrace::detail::libdwarf::line_entry_const&,cpptrace::detail::libdwarf::line_entry_const&)_1_>>
                    (local_108.
                     super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_108.
                     super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<cpptrace::detail::libdwarf::line_entry*,std::vector<cpptrace::detail::libdwarf::line_entry,std::allocator<cpptrace::detail::libdwarf::line_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(cpptrace::detail::libdwarf::die_object_const&)::_lambda(cpptrace::detail::libdwarf::line_entry_const&,cpptrace::detail::libdwarf::line_entry_const&)_1_>>
                    (plVar1,plVar2);
          this = (dwarf_resolver *)local_80;
          this_00 = local_88;
        }
      }
      local_68 = local_78;
      local_60 = (Dwarf_Line_Context)local_90._M_p;
      local_58.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_108.
           super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_58.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_108.
           super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_58.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_108.
           super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_108.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e0._0_8_ = local_70;
      local_e0._8_8_ = local_78;
      local_e0._16_8_ = local_90._M_p;
      std::
      vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ::vector((vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                *)(local_e0 + 0x18),&local_58);
      pVar12 = std::
               _Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>,std::allocator<std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::
               _M_emplace<std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>>
                         (this_00,local_e0);
      std::
      vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ::~vector((vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                 *)(local_e0 + 0x18));
      std::
      vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ::~vector(&local_58);
      *(undefined1 *)&(((string *)((long)this + 8))->_M_dataplus)._M_p = 1;
      *(long *)this =
           (long)pVar12.first.
                 super__Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
                 ._M_cur.
                 super__Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
           + 0x10;
      std::
      vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ::~vector(&local_108);
      uVar10 = extraout_RDX_01;
    }
    else {
      if (iVar3 != -1) {
        assert_fail((detail *)0x1,0x1d2c59,
                    "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                    ,(source_location)ZEXT816(0x283),
                    (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      }
      *(undefined1 *)&(this->object_path)._M_dataplus._M_p = 0;
      uVar10 = extraout_RDX_00;
    }
  }
  else {
    *(undefined1 *)&(this->object_path)._M_dataplus._M_p = 1;
    (this->super_symbol_resolver)._vptr_symbol_resolver =
         (_func_int **)
         ((long)iVar5.
                super__Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
                ._M_cur + 0x10);
    uVar10 = extraout_RDX;
  }
  oVar13._8_8_ = uVar10;
  oVar13.field_0 =
       (anon_union_8_2_d41c7fdf_for_optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>_2
        )this;
  return oVar13;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        optional<std::reference_wrapper<line_table_info>> get_line_table(const die_object& cu_die) {
            auto off = cu_die.get_global_offset();
            auto it = line_tables.find(off);
            if(it != line_tables.end()) {
                return it->second;
            } else {
                Dwarf_Unsigned version;
                Dwarf_Small table_count;
                Dwarf_Line_Context line_context;
                int ret = wrap(
                    dwarf_srclines_b,
                    cu_die.get(),
                    &version,
                    &table_count,
                    &line_context
                );
                static_assert(std::is_unsigned<decltype(table_count)>::value, "Expected unsigned Dwarf_Small");
                VERIFY(/*table_count >= 0 &&*/ table_count <= 2, "Unknown dwarf line table count");
                if(ret == DW_DLV_NO_ENTRY) {
                    // TODO: Failing silently for now
                    return nullopt;
                }
                VERIFY(ret == DW_DLV_OK);

                std::vector<line_entry> line_entries;

                if(get_cache_mode() == cache_mode::prioritize_speed) {
                    // build lookup table
                    Dwarf_Line* line_buffer = nullptr;
                    Dwarf_Signed line_count = 0;
                    Dwarf_Line* linebuf_actuals = nullptr;
                    Dwarf_Signed linecount_actuals = 0;
                    VERIFY(
                        wrap(
                            dwarf_srclines_two_level_from_linecontext,
                            line_context,
                            &line_buffer,
                            &line_count,
                            &linebuf_actuals,
                            &linecount_actuals
                        ) == DW_DLV_OK
                    );

                    // TODO: Make any attempt to note PC ranges? Handle line end sequence?
                    line_entries.reserve(line_count);
                    for(int i = 0; i < line_count; i++) {
                        Dwarf_Line line = line_buffer[i];
                        Dwarf_Addr low_addr = 0;
                        VERIFY(wrap(dwarf_lineaddr, line, &low_addr) == DW_DLV_OK);
                        // scan ahead for the last line entry matching this pc
                        int j;
                        for(j = i + 1; j < line_count; j++) {
                            Dwarf_Addr addr = 0;
                            VERIFY(wrap(dwarf_lineaddr, line_buffer[j], &addr) == DW_DLV_OK);
                            if(addr != low_addr) {
                                break;
                            }
                        }
                        line = line_buffer[j - 1];
                        // {
                        //     Dwarf_Unsigned line_number = 0;
                        //     VERIFY(wrap(dwarf_lineno, line, &line_number) == DW_DLV_OK);
                        //     frame.line = static_cast<std::uint32_t>(line_number);
                        //     char* filename = nullptr;
                        //     VERIFY(wrap(dwarf_linesrc, line, &filename) == DW_DLV_OK);
                        //     auto wrapper = raii_wrap(
                        //         filename,
                        //         [this] (char* str) { if(str) dwarf_dealloc(dbg, str, DW_DLA_STRING); }
                        //     );
                        //     frame.filename = filename;
                        //     printf("%s : %d\n", filename, line_number);
                        //     Dwarf_Bool is_line_end;
                        //     VERIFY(wrap(dwarf_lineendsequence, line, &is_line_end) == DW_DLV_OK);
                        //     if(is_line_end) {
                        //         puts("Line end");
                        //     }
                        // }
                        line_entries.push_back({
                            low_addr,
                            line
                        });
                        i = j - 1;
                    }
                    // sort lines
                    std::sort(line_entries.begin(), line_entries.end(), [] (const line_entry& a, const line_entry& b) {
                        return a.low < b.low;
                    });
                }

                it = line_tables.insert({off, {version, line_context, std::move(line_entries)}}).first;
                return it->second;
            }
        }